

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Quaternion QuaternionScale(Quaternion q,float mul)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Quaternion QVar5;
  
  fVar2 = q.x;
  fVar3 = q.y;
  fVar1 = q.z;
  fVar4 = q.w;
  QVar5.x = -fVar1 * mul + fVar2 * mul + fVar4 * mul + fVar3 * mul;
  QVar5.y = -fVar2 * mul + fVar3 * mul + fVar4 * mul + fVar1 * mul;
  QVar5.w = -fVar1 * mul + fVar4 * mul + -fVar2 * mul + -fVar3 * mul;
  QVar5.z = -fVar3 * mul + fVar1 * mul + fVar4 * mul + fVar2 * mul;
  return QVar5;
}

Assistant:

RMDEF Quaternion QuaternionScale(Quaternion q, float mul)
{
    Quaternion result = { 0 };

    float qax = q.x, qay = q.y, qaz = q.z, qaw = q.w;

    result.x = qax*mul + qaw*mul + qay*mul - qaz*mul;
    result.y = qay*mul + qaw*mul + qaz*mul - qax*mul;
    result.z = qaz*mul + qaw*mul + qax*mul - qay*mul;
    result.w = qaw*mul - qax*mul - qay*mul - qaz*mul;

    return result;
}